

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_points.h
# Opt level: O3

PrimInfoMB * __thiscall
embree::avx::PointsISA::createPrimRefMBArray
          (PrimInfoMB *__return_storage_ptr__,PointsISA *this,mvector<PrimRefMB> *prims,BBox1f *t0t1
          ,range<unsigned_long> *r,size_t k,uint geomID)

{
  float fVar1;
  float fVar2;
  float fVar3;
  BBox1f BVar4;
  BufferView<embree::Vec3fx> *pBVar5;
  PrimRefMB *pPVar6;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar7;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar8;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar9;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar10;
  float fVar11;
  int iVar12;
  undefined4 uVar13;
  long lVar14;
  char *pcVar15;
  long lVar16;
  size_t *psVar17;
  ulong uVar18;
  ulong uVar19;
  long lVar20;
  size_t sVar21;
  ulong uVar22;
  uint uVar23;
  uint uVar24;
  unsigned_long uVar25;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [64];
  float fVar32;
  float fVar33;
  undefined1 auVar31 [16];
  float fVar34;
  undefined1 auVar35 [16];
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  float fVar42;
  float fVar43;
  float fVar44;
  undefined1 auVar41 [16];
  float fVar48;
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [64];
  undefined1 auVar51 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar52;
  undefined1 auVar53 [64];
  undefined1 auVar54 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar55;
  undefined1 auVar56 [64];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar57;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar58;
  undefined1 auVar59 [64];
  float fVar60;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar61;
  undefined1 auVar62 [64];
  float fVar63;
  float fVar65;
  float fVar66;
  float fVar67;
  undefined1 auVar64 [16];
  float fVar70;
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  float fVar71;
  undefined1 auVar72 [16];
  unsigned_long local_e0;
  undefined1 local_d8 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_c8;
  
  (__return_storage_ptr__->object_range)._begin = 0;
  (__return_storage_ptr__->object_range)._end = 0;
  uVar22 = r->_begin;
  uVar25 = r->_end;
  local_d8 = SUB6416(ZEXT464(0x3f800000),0);
  if (uVar22 < uVar25) {
    auVar30 = ZEXT1664(ZEXT816(0x3f80000000000000));
    auVar29._8_4_ = 0xff800000;
    auVar29._0_8_ = 0xff800000ff800000;
    auVar29._12_4_ = 0xff800000;
    auVar50 = ZEXT1664(auVar29);
    local_c8.m128[2] = INFINITY;
    local_c8._0_8_ = 0x7f8000007f800000;
    local_c8.m128[3] = INFINITY;
    auVar53 = ZEXT1664((undefined1  [16])local_c8);
    local_e0 = 0;
    auVar62 = ZEXT1664(auVar29);
    auVar56 = ZEXT1664((undefined1  [16])local_c8);
    auVar59 = ZEXT1664(auVar29);
    sVar21 = 0;
    uVar19 = 0;
    do {
      BVar4 = (this->super_Points).super_Geometry.time_range;
      auVar72._8_8_ = 0;
      auVar72._0_4_ = BVar4.lower;
      auVar72._4_4_ = BVar4.upper;
      auVar29 = vmovshdup_avx(auVar72);
      fVar32 = BVar4.lower;
      fVar11 = auVar29._0_4_ - fVar32;
      pBVar5 = (this->super_Points).vertices.items;
      if ((uVar22 & 0xffffffff) < (pBVar5->super_RawBufferView).num) {
        fVar1 = (this->super_Points).super_Geometry.fnumTimeSegments;
        auVar26 = ZEXT416((uint)(fVar1 * ((t0t1->upper - fVar32) / fVar11) * 0.99999976));
        auVar26 = vroundss_avx(auVar26,auVar26,10);
        auVar27 = vminss_avx(auVar26,ZEXT416((uint)fVar1));
        fVar60 = t0t1->lower - fVar32;
        auVar45._0_12_ = ZEXT812(0);
        auVar45._12_4_ = 0;
        auVar26 = ZEXT416((uint)(fVar1 * (fVar60 / fVar11) * 1.0000002));
        auVar26 = vroundss_avx(auVar26,auVar26,9);
        auVar26 = vmaxss_avx(auVar45,auVar26);
        if ((uint)(int)auVar26._0_4_ <= (uint)(int)auVar27._0_4_) {
          uVar18 = (ulong)(int)auVar26._0_4_;
          psVar17 = &pBVar5[uVar18].super_RawBufferView.stride;
          do {
            lVar14 = *psVar17 * (uVar22 & 0xffffffff);
            if (*(float *)(((RawBufferView *)(psVar17 + -2))->ptr_ofs + lVar14 + 0xc) < 0.0)
            goto LAB_012514a1;
            auVar26 = *(undefined1 (*) [16])(((RawBufferView *)(psVar17 + -2))->ptr_ofs + lVar14);
            auVar46._8_4_ = 0xddccb9a2;
            auVar46._0_8_ = 0xddccb9a2ddccb9a2;
            auVar46._12_4_ = 0xddccb9a2;
            auVar45 = vcmpps_avx(auVar26,auVar46,2);
            auVar64._8_4_ = 0x5dccb9a2;
            auVar64._0_8_ = 0x5dccb9a25dccb9a2;
            auVar64._12_4_ = 0x5dccb9a2;
            auVar26 = vcmpps_avx(auVar26,auVar64,5);
            auVar26 = vorps_avx(auVar45,auVar26);
            uVar13 = vmovmskps_avx(auVar26);
            if ((char)uVar13 != '\0') goto LAB_012514a1;
            uVar18 = uVar18 + 1;
            psVar17 = psVar17 + 7;
            auVar45 = ZEXT816(0) << 0x20;
          } while (uVar18 <= (ulong)(long)(int)auVar27._0_4_);
        }
        fVar34 = auVar29._0_4_ - fVar32;
        fVar60 = fVar60 / fVar34;
        fVar34 = (t0t1->upper - fVar32) / fVar34;
        fVar11 = fVar1 * fVar60;
        fVar32 = fVar1 * fVar34;
        auVar27 = vroundss_avx(ZEXT416((uint)fVar11),ZEXT416((uint)fVar11),9);
        auVar46 = vroundss_avx(ZEXT416((uint)fVar32),ZEXT416((uint)fVar32),10);
        auVar29 = vmaxss_avx(auVar27,auVar45);
        auVar26 = vminss_avx(auVar46,ZEXT416((uint)fVar1));
        fVar33 = auVar26._0_4_;
        iVar12 = (int)auVar27._0_4_;
        if ((int)auVar27._0_4_ < 0) {
          iVar12 = -1;
        }
        uVar24 = (int)fVar1 + 1U;
        if ((int)auVar46._0_4_ < (int)((int)fVar1 + 1U)) {
          uVar24 = (int)auVar46._0_4_;
        }
        lVar14 = (long)(int)auVar29._0_4_;
        pcVar15 = pBVar5[lVar14].super_RawBufferView.ptr_ofs;
        lVar16 = pBVar5[lVar14].super_RawBufferView.stride * uVar22;
        auVar26 = *(undefined1 (*) [16])(pcVar15 + lVar16);
        fVar2 = (this->super_Points).maxRadiusScale;
        auVar27 = ZEXT416((uint)(fVar2 * *(float *)(pcVar15 + lVar16 + 0xc)));
        auVar27 = vshufps_avx(auVar27,auVar27,0);
        auVar45 = vsubps_avx(auVar26,auVar27);
        fVar36 = auVar26._0_4_ + auVar27._0_4_;
        fVar37 = auVar26._4_4_ + auVar27._4_4_;
        fVar38 = auVar26._8_4_ + auVar27._8_4_;
        fVar39 = auVar26._12_4_ + auVar27._12_4_;
        lVar16 = (long)(int)fVar33;
        pcVar15 = pBVar5[lVar16].super_RawBufferView.ptr_ofs;
        lVar20 = pBVar5[lVar16].super_RawBufferView.stride * uVar22;
        auVar26 = *(undefined1 (*) [16])(pcVar15 + lVar20);
        auVar27 = ZEXT416((uint)(fVar2 * *(float *)(pcVar15 + lVar20 + 0xc)));
        auVar27 = vshufps_avx(auVar27,auVar27,0);
        auVar46 = vsubps_avx(auVar26,auVar27);
        fVar40 = auVar26._0_4_ + auVar27._0_4_;
        fVar42 = auVar26._4_4_ + auVar27._4_4_;
        fVar43 = auVar26._8_4_ + auVar27._8_4_;
        fVar44 = auVar26._12_4_ + auVar27._12_4_;
        pcVar15 = (char *)(ulong)(uVar24 - iVar12);
        auVar29 = ZEXT416((uint)(fVar11 - auVar29._0_4_));
        fVar70 = auVar46._0_4_;
        fVar63 = auVar45._0_4_;
        fVar71 = auVar46._4_4_;
        fVar48 = auVar46._8_4_;
        fVar11 = auVar46._12_4_;
        fVar65 = auVar45._4_4_;
        fVar66 = auVar45._8_4_;
        fVar67 = auVar45._12_4_;
        if (uVar24 - iVar12 == 1) {
          auVar29 = vmaxss_avx(auVar29,ZEXT816(0) << 0x40);
          auVar26 = vshufps_avx(auVar29,auVar29,0);
          auVar29 = ZEXT416((uint)(1.0 - auVar29._0_4_));
          auVar29 = vshufps_avx(auVar29,auVar29,0);
          auVar31._0_4_ = auVar26._0_4_ * fVar70 + fVar63 * auVar29._0_4_;
          auVar31._4_4_ = auVar26._4_4_ * fVar71 + fVar65 * auVar29._4_4_;
          auVar31._8_4_ = auVar26._8_4_ * fVar48 + fVar66 * auVar29._8_4_;
          auVar31._12_4_ = auVar26._12_4_ * fVar11 + fVar67 * auVar29._12_4_;
          auVar68._0_4_ = auVar26._0_4_ * fVar40 + auVar29._0_4_ * fVar36;
          auVar68._4_4_ = auVar26._4_4_ * fVar42 + auVar29._4_4_ * fVar37;
          auVar68._8_4_ = auVar26._8_4_ * fVar43 + auVar29._8_4_ * fVar38;
          auVar68._12_4_ = auVar26._12_4_ * fVar44 + auVar29._12_4_ * fVar39;
          auVar29 = vmaxss_avx(ZEXT416((uint)(fVar33 - fVar32)),ZEXT816(0));
          auVar26 = vshufps_avx(auVar29,auVar29,0);
          auVar29 = ZEXT416((uint)(1.0 - auVar29._0_4_));
          auVar29 = vshufps_avx(auVar29,auVar29,0);
          auVar49._0_4_ = fVar63 * auVar26._0_4_ + fVar70 * auVar29._0_4_;
          auVar49._4_4_ = fVar65 * auVar26._4_4_ + fVar71 * auVar29._4_4_;
          auVar49._8_4_ = fVar66 * auVar26._8_4_ + fVar48 * auVar29._8_4_;
          auVar49._12_4_ = fVar67 * auVar26._12_4_ + fVar11 * auVar29._12_4_;
          auVar35._0_4_ = fVar36 * auVar26._0_4_ + fVar40 * auVar29._0_4_;
          auVar35._4_4_ = fVar37 * auVar26._4_4_ + fVar42 * auVar29._4_4_;
          auVar35._8_4_ = fVar38 * auVar26._8_4_ + fVar43 * auVar29._8_4_;
          auVar35._12_4_ = fVar39 * auVar26._12_4_ + fVar44 * auVar29._12_4_;
        }
        else {
          pcVar15 = pBVar5[lVar14 + 1].super_RawBufferView.ptr_ofs;
          lVar14 = pBVar5[lVar14 + 1].super_RawBufferView.stride * uVar22;
          auVar26 = *(undefined1 (*) [16])(pcVar15 + lVar14);
          fVar3 = *(float *)(pcVar15 + lVar14 + 0xc);
          auVar69._0_4_ = fVar2 * fVar3;
          auVar69._4_4_ = fVar2 * fVar3;
          auVar69._8_4_ = fVar2 * fVar3;
          auVar69._12_4_ = fVar2 * fVar3;
          auVar46 = vsubps_avx(auVar26,auVar69);
          pcVar15 = pBVar5[lVar16 + -1].super_RawBufferView.ptr_ofs;
          lVar14 = pBVar5[lVar16 + -1].super_RawBufferView.stride * uVar22;
          auVar27 = *(undefined1 (*) [16])(pcVar15 + lVar14);
          fVar3 = *(float *)(pcVar15 + lVar14 + 0xc);
          auVar54._0_4_ = fVar2 * fVar3;
          auVar54._4_4_ = fVar2 * fVar3;
          auVar54._8_4_ = fVar2 * fVar3;
          auVar54._12_4_ = fVar2 * fVar3;
          auVar64 = vsubps_avx(auVar27,auVar54);
          auVar29 = vmaxss_avx(auVar29,ZEXT416(0) << 0x20);
          auVar45 = vshufps_avx(auVar29,auVar29,0);
          auVar29 = ZEXT416((uint)(1.0 - auVar29._0_4_));
          auVar29 = vshufps_avx(auVar29,auVar29,0);
          auVar31._0_4_ = fVar63 * auVar29._0_4_ + auVar46._0_4_ * auVar45._0_4_;
          auVar31._4_4_ = fVar65 * auVar29._4_4_ + auVar46._4_4_ * auVar45._4_4_;
          auVar31._8_4_ = fVar66 * auVar29._8_4_ + auVar46._8_4_ * auVar45._8_4_;
          auVar31._12_4_ = fVar67 * auVar29._12_4_ + auVar46._12_4_ * auVar45._12_4_;
          auVar68._0_4_ = auVar29._0_4_ * fVar36 + auVar45._0_4_ * (auVar69._0_4_ + auVar26._0_4_);
          auVar68._4_4_ = auVar29._4_4_ * fVar37 + auVar45._4_4_ * (auVar69._4_4_ + auVar26._4_4_);
          auVar68._8_4_ = auVar29._8_4_ * fVar38 + auVar45._8_4_ * (auVar69._8_4_ + auVar26._8_4_);
          auVar68._12_4_ =
               auVar29._12_4_ * fVar39 + auVar45._12_4_ * (auVar69._12_4_ + auVar26._12_4_);
          auVar29 = vmaxss_avx(ZEXT416((uint)(fVar33 - fVar32)),ZEXT416(0));
          auVar26 = vshufps_avx(auVar29,auVar29,0);
          auVar29 = ZEXT416((uint)(1.0 - auVar29._0_4_));
          auVar29 = vshufps_avx(auVar29,auVar29,0);
          auVar49._0_4_ = fVar70 * auVar29._0_4_ + auVar26._0_4_ * auVar64._0_4_;
          auVar49._4_4_ = fVar71 * auVar29._4_4_ + auVar26._4_4_ * auVar64._4_4_;
          auVar49._8_4_ = fVar48 * auVar29._8_4_ + auVar26._8_4_ * auVar64._8_4_;
          auVar49._12_4_ = fVar11 * auVar29._12_4_ + auVar26._12_4_ * auVar64._12_4_;
          auVar35._0_4_ = fVar40 * auVar29._0_4_ + (auVar27._0_4_ + auVar54._0_4_) * auVar26._0_4_;
          auVar35._4_4_ = fVar42 * auVar29._4_4_ + (auVar27._4_4_ + auVar54._4_4_) * auVar26._4_4_;
          auVar35._8_4_ = fVar43 * auVar29._8_4_ + (auVar27._8_4_ + auVar54._8_4_) * auVar26._8_4_;
          auVar35._12_4_ =
               fVar44 * auVar29._12_4_ + (auVar27._12_4_ + auVar54._12_4_) * auVar26._12_4_;
          uVar23 = iVar12 + 1;
          if ((int)uVar23 < (int)uVar24) {
            psVar17 = &pBVar5[uVar23].super_RawBufferView.stride;
            do {
              auVar26._0_4_ = ((float)(int)uVar23 / fVar1 - fVar60) / (fVar34 - fVar60);
              auVar26._4_12_ = SUB6012((undefined1  [60])0x0,0);
              auVar29 = vshufps_avx(auVar26,auVar26,0);
              fVar40 = auVar49._4_4_;
              fVar42 = auVar49._8_4_;
              fVar43 = auVar49._12_4_;
              auVar26 = vshufps_avx(ZEXT416((uint)(1.0 - auVar26._0_4_)),
                                    ZEXT416((uint)(1.0 - auVar26._0_4_)),0);
              fVar32 = auVar31._4_4_;
              fVar33 = auVar31._8_4_;
              fVar36 = auVar31._12_4_;
              auVar47._0_4_ = auVar49._0_4_ * auVar29._0_4_ + auVar31._0_4_ * auVar26._0_4_;
              auVar47._4_4_ = fVar40 * auVar29._4_4_ + fVar32 * auVar26._4_4_;
              auVar47._8_4_ = fVar42 * auVar29._8_4_ + fVar33 * auVar26._8_4_;
              auVar47._12_4_ = fVar43 * auVar29._12_4_ + fVar36 * auVar26._12_4_;
              fVar37 = auVar35._4_4_;
              fVar38 = auVar35._8_4_;
              fVar39 = auVar35._12_4_;
              fVar44 = auVar68._4_4_;
              fVar70 = auVar68._8_4_;
              fVar71 = auVar68._12_4_;
              auVar27._0_4_ = auVar35._0_4_ * auVar29._0_4_ + auVar68._0_4_ * auVar26._0_4_;
              auVar27._4_4_ = fVar37 * auVar29._4_4_ + fVar44 * auVar26._4_4_;
              auVar27._8_4_ = fVar38 * auVar29._8_4_ + fVar70 * auVar26._8_4_;
              auVar27._12_4_ = fVar39 * auVar29._12_4_ + fVar71 * auVar26._12_4_;
              pcVar15 = ((RawBufferView *)(psVar17 + -2))->ptr_ofs;
              auVar29 = *(undefined1 (*) [16])(pcVar15 + *psVar17 * uVar22);
              fVar11 = *(float *)(pcVar15 + *psVar17 * uVar22 + 0xc);
              auVar51._0_4_ = fVar2 * fVar11;
              auVar51._4_4_ = fVar2 * fVar11;
              auVar51._8_4_ = fVar2 * fVar11;
              auVar51._12_4_ = fVar2 * fVar11;
              auVar26 = vsubps_avx(auVar29,auVar51);
              auVar26 = vsubps_avx(auVar26,auVar47);
              auVar41._0_4_ = auVar29._0_4_ + auVar51._0_4_;
              auVar41._4_4_ = auVar29._4_4_ + auVar51._4_4_;
              auVar41._8_4_ = auVar29._8_4_ + auVar51._8_4_;
              auVar41._12_4_ = auVar29._12_4_ + auVar51._12_4_;
              auVar29 = vsubps_avx(auVar41,auVar27);
              auVar26 = vminps_avx(auVar26,ZEXT816(0) << 0x40);
              auVar29 = vmaxps_avx(auVar29,ZEXT816(0) << 0x40);
              auVar31._0_4_ = auVar31._0_4_ + auVar26._0_4_;
              auVar31._4_4_ = fVar32 + auVar26._4_4_;
              auVar31._8_4_ = fVar33 + auVar26._8_4_;
              auVar31._12_4_ = fVar36 + auVar26._12_4_;
              auVar49._0_4_ = auVar49._0_4_ + auVar26._0_4_;
              auVar49._4_4_ = fVar40 + auVar26._4_4_;
              auVar49._8_4_ = fVar42 + auVar26._8_4_;
              auVar49._12_4_ = fVar43 + auVar26._12_4_;
              auVar68._0_4_ = auVar68._0_4_ + auVar29._0_4_;
              auVar68._4_4_ = fVar44 + auVar29._4_4_;
              auVar68._8_4_ = fVar70 + auVar29._8_4_;
              auVar68._12_4_ = fVar71 + auVar29._12_4_;
              auVar35._0_4_ = auVar35._0_4_ + auVar29._0_4_;
              auVar35._4_4_ = fVar37 + auVar29._4_4_;
              auVar35._8_4_ = fVar38 + auVar29._8_4_;
              auVar35._12_4_ = fVar39 + auVar29._12_4_;
              uVar23 = uVar23 + 1;
              psVar17 = psVar17 + 7;
            } while (uVar24 != uVar23);
          }
        }
        aVar7 = (anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1)
                vinsertps_avx(auVar31,ZEXT416(geomID),0x30);
        uVar24 = (this->super_Points).super_Geometry.numTimeSteps - 1;
        uVar18 = (ulong)uVar24;
        aVar8 = (anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1)
                vinsertps_avx(auVar68,ZEXT416((uint)uVar22),0x30);
        aVar9 = (anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1)
                vinsertps_avx(auVar49,ZEXT416(uVar24),0x30);
        aVar10 = (anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1)
                 vinsertps_avx(auVar35,ZEXT416(uVar24),0x30);
        auVar27 = vcmpps_avx(local_d8,auVar72,1);
        auVar29 = vblendps_avx(local_d8,auVar72,2);
        auVar26 = vblendps_avx(auVar72,local_d8,2);
        local_d8 = vblendvps_avx(auVar26,auVar29,auVar27);
        auVar28._0_4_ = aVar7.x * 0.5 + aVar9.x * 0.5 + aVar8.x * 0.5 + aVar10.x * 0.5;
        auVar28._4_4_ = aVar7.y * 0.5 + aVar9.y * 0.5 + aVar8.y * 0.5 + aVar10.y * 0.5;
        auVar28._8_4_ = aVar7.z * 0.5 + aVar9.z * 0.5 + aVar8.z * 0.5 + aVar10.z * 0.5;
        auVar28._12_4_ =
             aVar7.field_3.w * 0.5 + aVar9.field_3.w * 0.5 +
             aVar8.field_3.w * 0.5 + aVar10.field_3.w * 0.5;
        auVar29 = vminps_avx(auVar56._0_16_,auVar28);
        auVar56 = ZEXT1664(auVar29);
        auVar29 = vmaxps_avx(auVar59._0_16_,auVar28);
        auVar59 = ZEXT1664(auVar29);
        local_e0 = local_e0 + 1;
        sVar21 = sVar21 + uVar18;
        auVar29 = vpshufd_avx(ZEXT416((uint)CONCAT71((int7)((ulong)pcVar15 >> 8),uVar19 < uVar18)),
                              0x50);
        auVar29 = vpslld_avx(auVar29,0x1f);
        auVar29 = vblendvps_avx(auVar30._0_16_,auVar72,auVar29);
        auVar30 = ZEXT1664(auVar29);
        auVar29 = vminps_avx(auVar53._0_16_,(undefined1  [16])aVar7);
        auVar53 = ZEXT1664(auVar29);
        if (uVar19 <= uVar18) {
          uVar19 = uVar18;
        }
        pPVar6 = prims->items;
        pPVar6[k].lbounds.bounds0.lower.field_0.field_1 = aVar7;
        auVar29 = vmaxps_avx(auVar50._0_16_,(undefined1  [16])aVar8);
        auVar50 = ZEXT1664(auVar29);
        pPVar6[k].lbounds.bounds0.upper.field_0.field_1 = aVar8;
        local_c8.m128 = (__m128)vminps_avx(local_c8.m128,(undefined1  [16])aVar9);
        pPVar6[k].lbounds.bounds1.lower.field_0.field_1 = aVar9;
        auVar29 = vmaxps_avx(auVar62._0_16_,(undefined1  [16])aVar10);
        auVar62 = ZEXT1664(auVar29);
        pPVar6[k].lbounds.bounds1.upper.field_0.field_1 = aVar10;
        BVar4 = (BBox1f)vmovlps_avx(auVar72);
        pPVar6[k].time_range = BVar4;
        k = k + 1;
        uVar25 = r->_end;
      }
LAB_012514a1:
      aVar57 = auVar50._0_16_;
      auVar29 = auVar30._0_16_;
      uVar22 = uVar22 + 1;
    } while (uVar22 < uVar25);
    (__return_storage_ptr__->object_range)._end = local_e0;
    aVar52 = auVar53._0_16_;
    aVar61 = auVar62._0_16_;
    aVar55 = auVar56._0_16_;
    aVar58 = auVar59._0_16_;
  }
  else {
    auVar29 = ZEXT816(0x3f80000000000000);
    local_c8.m128[2] = INFINITY;
    local_c8._0_8_ = 0x7f8000007f800000;
    local_c8.m128[3] = INFINITY;
    aVar57.m128[2] = -INFINITY;
    aVar57._0_8_ = 0xff800000ff800000;
    aVar57.m128[3] = -INFINITY;
    uVar19 = 0;
    sVar21 = 0;
    aVar52 = local_c8;
    aVar61 = aVar57;
    aVar55 = local_c8;
    aVar58 = aVar57;
  }
  auVar29 = vunpcklpd_avx(auVar29,local_d8);
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds0.lower.
  field_0 = aVar52;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds0.upper.
  field_0 = aVar57;
  *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)
   (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds1.lower
   .field_0.m128 = local_c8;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds1.upper.
  field_0 = aVar61;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).centBounds.lower.field_0
       = aVar55;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).centBounds.upper.field_0
       = aVar58;
  __return_storage_ptr__->num_time_segments = sVar21;
  __return_storage_ptr__->max_num_time_segments = uVar19;
  (__return_storage_ptr__->max_time_range).lower = (float)(int)auVar29._0_8_;
  (__return_storage_ptr__->max_time_range).upper = (float)(int)((ulong)auVar29._0_8_ >> 0x20);
  (__return_storage_ptr__->time_range).lower = (float)(int)auVar29._8_8_;
  (__return_storage_ptr__->time_range).upper = (float)(int)((ulong)auVar29._8_8_ >> 0x20);
  return __return_storage_ptr__;
}

Assistant:

PrimInfoMB createPrimRefMBArray(mvector<PrimRefMB>& prims,
                                      const BBox1f& t0t1,
                                      const range<size_t>& r,
                                      size_t k,
                                      unsigned int geomID) const
      {
        PrimInfoMB pinfo(empty);
        for (size_t j = r.begin(); j < r.end(); j++) {
          if (!valid(j, timeSegmentRange(t0t1)))
            continue;
          const PrimRefMB prim(linearBounds(j, t0t1), this->numTimeSegments(), this->time_range, this->numTimeSegments(), geomID, unsigned(j));
          pinfo.add_primref(prim);
          prims[k++] = prim;
        }
        return pinfo;
      }